

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TicsSpecsBaseOf.hpp
# Opt level: O2

string * __thiscall
sciplot::TicsSpecsBaseOf<sciplot::TicsSpecs>::repr
          (string *__return_storage_ptr__,TicsSpecsBaseOf<sciplot::TicsSpecs> *this,string *axis)

{
  ostream *poVar1;
  bool bVar2;
  ostream *poVar3;
  string show;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  undefined1 local_1a8 [392];
  
  ShowSpecsOf<sciplot::TicsSpecs>::repr_abi_cxx11_
            (&local_1c8,&this->super_ShowSpecsOf<sciplot::TicsSpecs>);
  bVar2 = std::operator==(&local_1c8,"no");
  if (bVar2) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "unset ",axis);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "tics");
    std::__cxx11::string::~string((string *)local_1a8);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
    std::operator+(&local_1e8,"set ",axis);
    std::operator+(&bStack_228,&local_1e8,"tics");
    poVar1 = (ostream *)(local_1a8 + 0x10);
    poVar3 = std::operator<<(poVar1,(string *)&bStack_228);
    std::operator<<(poVar3," ");
    std::__cxx11::string::~string((string *)&bStack_228);
    std::__cxx11::string::~string((string *)&local_1e8);
    poVar3 = std::operator<<(poVar1,(string *)&this->m_along);
    std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar1,(string *)&this->m_mirror);
    std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar1,(string *)&this->m_inout);
    std::operator<<(poVar3," ");
    std::operator<<(poVar1,"scale ");
    poVar3 = std::ostream::_M_insert<double>(this->m_scalemajor);
    std::operator<<(poVar3,",");
    poVar3 = std::ostream::_M_insert<double>(this->m_scaleminor);
    std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar1,(string *)&this->m_rotate);
    std::operator<<(poVar3," ");
    OffsetSpecsOf<sciplot::TicsSpecs>::repr_abi_cxx11_
              (&bStack_228,&this->super_OffsetSpecsOf<sciplot::TicsSpecs>);
    poVar3 = std::operator<<(poVar1,(string *)&bStack_228);
    std::operator<<(poVar3," ");
    std::__cxx11::string::~string((string *)&bStack_228);
    TextSpecsOf<sciplot::TicsSpecs>::repr_abi_cxx11_
              (&bStack_228,&this->super_TextSpecsOf<sciplot::TicsSpecs>);
    poVar3 = std::operator<<(poVar1,(string *)&bStack_228);
    std::operator<<(poVar3," ");
    std::__cxx11::string::~string((string *)&bStack_228);
    std::operator<<(poVar1,(string *)&this->m_format);
    std::__cxx11::stringbuf::str();
    internal::removeExtraWhitespaces(__return_storage_ptr__,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  }
  std::__cxx11::string::~string((string *)&local_1c8);
  return __return_storage_ptr__;
}

Assistant:

auto TicsSpecsBaseOf<DerivedSpecs>::repr(std::string axis) const -> std::string
{
    const auto show = ShowSpecsOf<DerivedSpecs>::repr();
    if(show == "no")
        return "unset " + axis + "tics";

    std::stringstream ss;
    ss << "set " + axis + "tics" << " ";
    ss << m_along << " ";
    ss << m_mirror << " ";
    ss << m_inout << " ";
    ss << "scale " << m_scalemajor << "," << m_scaleminor << " ";
    ss << m_rotate << " ";
    ss << OffsetSpecsOf<DerivedSpecs>::repr() << " ";
    ss << TextSpecsOf<DerivedSpecs>::repr() << " ";
    ss << m_format;
    return internal::removeExtraWhitespaces(ss.str());
}